

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O0

bool __thiscall ftxui::anon_unknown_3::ToggleBase::OnEvent(ToggleBase *this,Event *event)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  ToggleOption *pTVar6;
  bool local_142;
  bool local_131;
  int local_104 [2];
  byte local_f9;
  Event local_f8;
  byte local_b1;
  Event local_b0;
  int local_70;
  int old_selected;
  Event local_60;
  Event *local_20;
  Event *event_local;
  ToggleBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar2 = Event::is_mouse(event);
  if (bVar2) {
    Event::Event(&local_60,event);
    this_local._7_1_ = OnMouseEvent(this,&local_60);
    Event::~Event(&local_60);
  }
  else {
    local_70 = *this->selected_;
    bVar2 = Event::operator==(event,(Event *)Event::ArrowLeft);
    local_b1 = 0;
    local_131 = true;
    if (!bVar2) {
      Event::Character(&local_b0,'h');
      local_b1 = 1;
      local_131 = Event::operator==(event,&local_b0);
    }
    if ((local_b1 & 1) != 0) {
      Event::~Event(&local_b0);
    }
    if (local_131 != false) {
      *this->selected_ = *this->selected_ + -1;
    }
    bVar2 = Event::operator==(event,(Event *)Event::ArrowRight);
    local_f9 = 0;
    local_142 = true;
    if (!bVar2) {
      Event::Character(&local_f8,'l');
      local_f9 = 1;
      local_142 = Event::operator==(event,&local_f8);
    }
    if ((local_f9 & 1) != 0) {
      Event::~Event(&local_f8);
    }
    if (local_142 != false) {
      *this->selected_ = *this->selected_ + 1;
    }
    bVar2 = Event::operator==(event,(Event *)Event::Tab);
    if ((bVar2) && (sVar4 = ConstStringListRef::size(&this->entries_), sVar4 != 0)) {
      iVar1 = *this->selected_;
      sVar4 = ConstStringListRef::size(&this->entries_);
      *this->selected_ = (int)((ulong)(long)(iVar1 + 1) % sVar4);
    }
    bVar2 = Event::operator==(event,(Event *)Event::TabReverse);
    if ((bVar2) && (sVar4 = ConstStringListRef::size(&this->entries_), sVar4 != 0)) {
      iVar1 = *this->selected_;
      sVar4 = ConstStringListRef::size(&this->entries_);
      sVar3 = ConstStringListRef::size(&this->entries_);
      *this->selected_ = (int)((((long)iVar1 + sVar4) - 1) % sVar3);
    }
    local_104[1] = 0;
    sVar4 = ConstStringListRef::size(&this->entries_);
    local_104[0] = (int)sVar4 + -1;
    piVar5 = std::min<int>(local_104,this->selected_);
    piVar5 = std::max<int>(local_104 + 1,piVar5);
    *this->selected_ = *piVar5;
    if (local_70 == *this->selected_) {
      bVar2 = Event::operator==(event,(Event *)Event::Return);
      if (bVar2) {
        pTVar6 = Ref<ftxui::ToggleOption>::operator->(&this->option_);
        std::function<void_()>::operator()(&pTVar6->on_enter);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      iVar1 = *this->selected_;
      piVar5 = focused_entry(this);
      *piVar5 = iVar1;
      pTVar6 = Ref<ftxui::ToggleOption>::operator->(&this->option_);
      std::function<void_()>::operator()(&pTVar6->on_change);
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    int old_selected = *selected_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      (*selected_)--;
    if (event == Event::ArrowRight || event == Event::Character('l'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (old_selected != *selected_) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }